

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.c
# Opt level: O0

char * lws_hdr_simple_ptr(lws *wsi,lws_token_indexes h)

{
  uint uVar1;
  int n;
  lws_token_indexes h_local;
  lws *wsi_local;
  
  if ((wsi->http).ah == (allocated_headers *)0x0) {
    wsi_local = (lws *)0x0;
  }
  else {
    uVar1 = (uint)((wsi->http).ah)->frag_index[h];
    if (uVar1 == 0) {
      wsi_local = (lws *)0x0;
    }
    else {
      wsi_local = (lws *)(((wsi->http).ah)->data + ((wsi->http).ah)->frags[(int)uVar1].offset);
    }
  }
  return (char *)wsi_local;
}

Assistant:

char *lws_hdr_simple_ptr(struct lws *wsi, enum lws_token_indexes h)
{
	int n;

	if (!wsi->http.ah)
		return NULL;

	n = wsi->http.ah->frag_index[h];
	if (!n)
		return NULL;

	return wsi->http.ah->data + wsi->http.ah->frags[n].offset;
}